

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_WFE(DisasContext_conflict1 *s,arg_WFE *a)

{
  TranslationBlock *extraout_RAX;
  TranslationBlock *pTVar1;
  
  pTVar1 = (s->base).tb;
  if ((pTVar1->cflags & 0x80000) == 0) {
    gen_set_pc_im(s,(s->base).pc_next);
    (s->base).is_jmp = DISAS_TARGET_4;
    pTVar1 = extraout_RAX;
  }
  return SUB81(pTVar1,0);
}

Assistant:

static bool trans_WFE(DisasContext *s, arg_WFE *a)
{
    /*
     * When running single-threaded TCG code, use the helper to ensure that
     * the next round-robin scheduled vCPU gets a crack.  In MTTCG mode we
     * just skip this instruction.  Currently the SEV/SEVL instructions,
     * which are *one* of many ways to wake the CPU from WFE, are not
     * implemented so we can't sleep like WFI does.
     */
    if (!(tb_cflags(s->base.tb) & CF_PARALLEL)) {
        gen_set_pc_im(s, s->base.pc_next);
        s->base.is_jmp = DISAS_WFE;
    }
    return true;
}